

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::ArrayPtr<const_unsigned_char>_&> __thiscall
kj::Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>::
find<0ul,kj::ArrayPtr<unsigned_char_const>&>
          (Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>> *this,
          ArrayPtr<const_unsigned_char> *params)

{
  HashIndex<kj::_::HashSetCallbacks> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  ArrayPtr<const_unsigned_char> *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> AVar3;
  unsigned_long *pos;
  ArrayPtr<const_unsigned_char> *local_50;
  ArrayPtr<const_unsigned_char> *local_48;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  ArrayPtr<const_unsigned_char> *params_local;
  Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_> *this_local;
  
  _pos583.field_1 = in_RDX;
  pHVar1 = get<0ul,kj::HashIndex<kj::_::HashSetCallbacks>&>
                     ((HashIndex<kj::_::HashSetCallbacks> *)(params + 2));
  AVar3 = Vector<kj::ArrayPtr<const_unsigned_char>_>::asPtr
                    ((Vector<kj::ArrayPtr<const_unsigned_char>_> *)params);
  fwd<kj::ArrayPtr<unsigned_char_const>&>((ArrayPtr<const_unsigned_char> *)_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (ArrayPtr<const_unsigned_char> *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (ArrayPtr<const_unsigned_char> *)pHVar1;
  HashIndex<kj::_::HashSetCallbacks>::
  find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
            ((HashIndex<kj::_::HashSetCallbacks> *)local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::ArrayPtr<const_unsigned_char>_&>::Maybe
              ((Maybe<kj::ArrayPtr<const_unsigned_char>_&> *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::ArrayPtr<const_unsigned_char>_>::operator[]
                  ((Vector<kj::ArrayPtr<const_unsigned_char>_> *)params,*puVar2);
    Maybe<kj::ArrayPtr<const_unsigned_char>_&>::Maybe
              ((Maybe<kj::ArrayPtr<const_unsigned_char>_&> *)this,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::ArrayPtr<const_unsigned_char>_&>)(ArrayPtr<const_unsigned_char> *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}